

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_0::CWriter::WriteLocals
          (CWriter *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *index_to_name)

{
  anon_class_24_3_a232a310 local_38;
  anon_class_1_0_00000001 local_1d;
  Index local_1c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_18;
  Index num_params;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *index_to_name_local;
  CWriter *this_local;
  
  pvStack_18 = index_to_name;
  index_to_name_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  local_1c = Func::GetNumParams(this->func_);
  local_38.index_to_name = pvStack_18;
  local_38.num_params = &local_1c;
  local_38.this = this;
  (anonymous_namespace)::CWriter::
  WriteVarsByType<wabt::LocalTypes,wabt::(anonymous_namespace)::CWriter::WriteLocals(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0,wabt::(anonymous_namespace)::CWriter::WriteLocals(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__1>
            ((CWriter *)this,&this->func_->local_types,&local_1d,&local_38,true);
  return;
}

Assistant:

void CWriter::WriteLocals(const std::vector<std::string>& index_to_name) {
  Index num_params = func_->GetNumParams();
  WriteVarsByType(
      func_->local_types, [](auto x) { return x; },
      [&](Index local_index, Type local_type) {
        Write(DefineParamName(index_to_name[num_params + local_index]), " = ");
        if (local_type.IsRef()) {
          Write(GetReferenceNullValue(local_type));
        } else if (local_type == Type::V128) {
          Write("simde_wasm_i64x2_make(0, 0)");
        } else {
          Write("0");
        }
      },
      true);
}